

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf262.c
# Opt level: O1

void ymf262_reset_chip(void *chip)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  
  *(undefined8 *)((long)chip + 0x12c0) = 0;
  *(undefined4 *)((long)chip + 0x22ec) = 1;
  *(undefined1 *)((long)chip + 0x230e) = 0;
  bVar1 = *(byte *)((long)chip + 0x230c) & 0x9f;
  *(byte *)((long)chip + 0x230c) = bVar1;
  if (bVar1 == 0x80) {
    *(undefined1 *)((long)chip + 0x230c) = 0;
    if (*(code **)((long)chip + 0x2320) != (code *)0x0) {
      (**(code **)((long)chip + 0x2320))(*(undefined8 *)((long)chip + 9000),0);
    }
  }
  *(undefined8 *)((long)chip + 0x22fc) = 0x100000000400;
  OPL3WriteReg((OPL3 *)chip,4,0);
  uVar5 = 0x100;
  do {
    uVar5 = uVar5 - 1;
    OPL3WriteReg((OPL3 *)chip,uVar5,0);
  } while (0x20 < uVar5);
  uVar5 = 0x200;
  do {
    uVar5 = uVar5 - 1;
    OPL3WriteReg((OPL3 *)chip,uVar5,0);
  } while (0x120 < uVar5);
  lVar2 = (long)chip + 0x5c;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined1 *)(lVar2 + -10 + lVar4) = 0;
      *(undefined4 *)(lVar2 + lVar4) = 0x1ff;
      lVar4 = lVar4 + 0x70;
    } while (lVar4 == 0x70);
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 0xf0;
  } while (lVar3 != 0x12);
  *(undefined1 *)((long)chip + 0x2340) = 1;
  return;
}

Assistant:

void ymf262_reset_chip(void *chip)
{
	OPL3ResetChip((OPL3 *)chip);
}